

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::OpenFile(BamMultiReaderPrivate *this,string *filename)

{
  bool bVar1;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string currentError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&filenames,1,filename,(allocator_type *)&currentError);
  bVar1 = Open(this,&filenames);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&currentError,(string *)&this->m_errorString);
    std::__cxx11::string::string((string *)&local_70,"could not open file: ",&local_d1);
    std::operator+(&local_b0,&local_70,filename);
    std::operator+(&local_d0,&local_b0,"\n\t");
    std::operator+(&message,&local_d0,&currentError);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_d0,"BamMultiReader::OpenFile",(allocator *)&local_b0);
    SetErrorString(this,&local_d0,&message);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&currentError);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  return bVar1;
}

Assistant:

bool BamMultiReaderPrivate::OpenFile(const std::string& filename)
{
    std::vector<std::string> filenames(1, filename);
    if (Open(filenames)) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("could not open file: ") + filename + "\n\t" + currentError;
        SetErrorString("BamMultiReader::OpenFile", message);
        return false;
    }
}